

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O2

int ffpxsz(int datatype)

{
  int iVar1;
  
  if ((datatype == 0xb) || (datatype == 0xe)) {
    return 1;
  }
  if (datatype == 0x52) {
LAB_001748a5:
    iVar1 = 8;
  }
  else {
    if (datatype == 0x15) {
      return 2;
    }
    if ((datatype != 0x1e) && (datatype != 0x1f)) {
      if ((datatype == 0x28) || (datatype == 0x29)) goto LAB_001748a5;
      if (datatype != 0x2a) {
        if (datatype == 0x14) {
          return 2;
        }
        return 0;
      }
    }
    iVar1 = 4;
  }
  return iVar1;
}

Assistant:

int ffpxsz(int datatype)
/*
   return the number of bytes per pixel associated with the datatype
*/
{
    if (datatype == TBYTE)
       return(sizeof(char));
    else if (datatype == TUSHORT)
       return(sizeof(short));
    else if (datatype == TSHORT)
       return(sizeof(short));
    else if (datatype == TULONG)
       return(sizeof(long));
    else if (datatype == TLONG)
       return(sizeof(long));
    else if (datatype == TINT)
       return(sizeof(int));
    else if (datatype == TUINT)
       return(sizeof(int));
    else if (datatype == TFLOAT)
       return(sizeof(float));
    else if (datatype == TDOUBLE)
       return(sizeof(double));
    else if (datatype == TLOGICAL)
       return(sizeof(char));
    else
       return(0);
}